

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void __thiscall
CVmObjDict::add_word
          (CVmObjDict *this,vm_obj_id_t self,char *str,size_t len,vm_obj_id_t obj,
          vm_prop_id_t voc_prop)

{
  int iVar1;
  dict_undo_rec *rec;
  char *pcVar2;
  
  iVar1 = add_hash_entry(this,str,len,1,obj,voc_prop,0);
  if ((iVar1 != 0) && (G_undo_X != (CVmUndo *)0x0)) {
    pcVar2 = (char *)0x1f;
    if (str != (char *)0x0) {
      pcVar2 = (char *)(len + 0x1f);
    }
    rec = (dict_undo_rec *)malloc((size_t)pcVar2);
    rec->action = DICT_UNDO_ADD;
    if (str != (char *)0x0) {
      pcVar2 = rec->txt;
      memcpy(pcVar2,str,len);
    }
    rec->len = len;
    rec->obj = obj;
    rec->prop = voc_prop;
    add_undo_rec((CVmObjDict *)pcVar2,self,rec);
  }
  pcVar2 = (this->super_CVmObject).ext_;
  pcVar2[0x18] = '\x01';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  return;
}

Assistant:

void CVmObjDict::add_word(VMG_ vm_obj_id_t self,
                          const char *str, size_t len,
                          vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    /* add the entry */
    int added = add_hash_entry(vmg_ str, len, TRUE, obj, voc_prop, FALSE);

    /* 
     *   if there's a global undo object, and we actually added a new
     *   entry, add undo for the change 
     */
    if (added && G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create the undo record */
        undo_rec = alloc_undo_rec(DICT_UNDO_ADD, str, len);
        undo_rec->obj = obj;
        undo_rec->prop = voc_prop;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;
}